

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O0

double ComputeRecall(uint32_t num,int K,int *gt,
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    *points)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference this;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *in_RCX;
  int in_ESI;
  uint in_EDI;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar4;
  pair<unsigned_int,_float> *p;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  int j;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> label;
  size_t i;
  int recalls;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Rb_tree_const_iterator<unsigned_int> in_stack_ffffffffffffff58;
  const_iterator in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  int local_5c;
  ulong local_28;
  int local_1c;
  
  local_1c = 0;
  for (local_28 = 0; local_28 < in_EDI; local_28 = local_28 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x113d2e
              );
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      pVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)in_stack_ffffffffffffff70._M_current,
                         &(in_stack_ffffffffffffff68._M_current)->first);
      in_stack_ffffffffffffff58 = pVar4.first._M_node;
      in_stack_ffffffffffffff57 = pVar4.second;
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::operator[](in_RCX,local_28);
    in_stack_ffffffffffffff70 =
         std::
         vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
         begin(in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff68 =
         std::
         vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
         end(in_stack_ffffffffffffff48);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                         (__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar2) break;
      this = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
             ::operator*((__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          *)&stack0xffffffffffffff70);
      in_stack_ffffffffffffff48 =
           (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            *)std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)this,&(in_stack_ffffffffffffff58._M_node)->_M_color);
      if (in_stack_ffffffffffffff48 !=
          (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           *)0x0) {
        local_1c = local_1c + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
      ::operator++((__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                    *)&stack0xffffffffffffff70);
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x113e6c
              );
  }
  auVar3._0_8_ = (double)local_1c;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar1 = vcvtusi2sd_avx512f(auVar3,in_EDI * in_ESI);
  return (auVar3._0_8_ * 1.0) / auVar1._0_8_;
}

Assistant:

double ComputeRecall(uint32_t num, int K, const int *gt, const std::vector<PointSet> &points) {
  int recalls = 0;
  for (size_t i = 0; i < num; i++) {
    std::set<uint32_t> label;
    for (int j = 0; j < K; j++) {
      label.insert(gt[i * K + j]);
    }
    for (const auto &p : points[i]) {
      if (label.count(p.first) != 0) {
        recalls += 1;
      }
    }
  }

  return 1.0 * recalls / (num * K);
}